

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

void __thiscall Search::predictor::free_ec(predictor *this)

{
  ulong uVar1;
  long lVar2;
  
  if (this->ec_alloced != true) {
    return;
  }
  if (this->is_ldf == true) {
    if (this->ec_cnt != 0) {
      lVar2 = 0;
      uVar1 = 0;
      do {
        VW::dealloc_example((_func_void_void_ptr *)PTR_delete_label_002daa58,
                            (example *)
                            ((long)(this->ec->super_example_predict).feature_space + lVar2 + -0x20),
                            (_func_void_void_ptr *)0x0);
        uVar1 = uVar1 + 1;
        lVar2 = lVar2 + 0x68d0;
      } while (uVar1 < this->ec_cnt);
    }
  }
  else {
    VW::dealloc_example((_func_void_void_ptr *)0x0,this->ec,(_func_void_void_ptr *)0x0);
  }
  free(this->ec);
  return;
}

Assistant:

void predictor::free_ec()
{
  if (ec_alloced)
  {
    if (is_ldf)
      for (size_t i = 0; i < ec_cnt; i++) VW::dealloc_example(CS::cs_label.delete_label, ec[i]);
    else
      VW::dealloc_example(nullptr, *ec);
    free(ec);
  }
}